

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

int XUtf8TextWidth(XUtf8FontStruct *font_set,char *string,int num_bytes)

{
  int *piVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  uint local_160;
  uint no_spc;
  uint ucs;
  int ulen;
  int *ranges;
  int iStack_148;
  char glyph [2];
  int nb_font;
  int last_fnum;
  int first;
  int i;
  int fnum;
  XChar2b buf [128];
  XFontStruct **fonts;
  int *encodings;
  int x;
  int num_bytes_local;
  char *string_local;
  XUtf8FontStruct *font_set_local;
  
  ranges._4_4_ = font_set->nb_font;
  encodings._0_4_ = 0;
  if (ranges._4_4_ < 1) {
    font_set_local._4_4_ = 0;
  }
  else {
    _ucs = font_set->ranges;
    buf._248_8_ = font_set->fonts;
    piVar1 = font_set->encodings;
    last_fnum = 0;
    first = 0;
    while( true ) {
      iVar5 = first;
      bVar6 = false;
      if (first < ranges._4_4_) {
        bVar6 = *(XFontStruct **)(buf._248_8_ + (long)first * 8) == (XFontStruct *)0x0;
      }
      if (!bVar6) break;
      first = first + 1;
    }
    encodings._4_4_ = num_bytes;
    _x = (uchar *)string;
    if (first < ranges._4_4_) {
      for (; iStack_148 = first, 0 < encodings._4_4_; encodings._4_4_ = encodings._4_4_ - no_spc) {
        if (0x78 < last_fnum) {
          iVar3 = XTextWidth16(*(undefined8 *)(buf._248_8_ + (long)first * 8),&i,last_fnum);
          encodings._0_4_ = iVar3 + (int)encodings;
          last_fnum = 0;
        }
        no_spc = XFastConvertUtf8ToUcs(_x,encodings._4_4_,&local_160);
        if ((int)no_spc < 1) {
          no_spc = 1;
        }
        uVar2 = XUtf8IsNonSpacing(local_160);
        uVar4 = (uint)uVar2;
        first = iVar5;
        if (uVar4 != 0) {
          local_160 = uVar4;
        }
        while ((first < ranges._4_4_ &&
               (((*(long *)(buf._248_8_ + (long)first * 8) == 0 ||
                 (iVar3 = ucs2fontmap((char *)((long)&ranges + 2),local_160,piVar1[first]),
                 iVar3 < 0)) ||
                ((piVar1[first] == 0 &&
                 (((int)local_160 < _ucs[first << 1] || (_ucs[first * 2 + 1] < (int)local_160)))))))
               )) {
          first = first + 1;
        }
        if (first == ranges._4_4_) {
          ucs2fontmap((char *)((long)&ranges + 2),0x3f,piVar1[iVar5]);
          first = iVar5;
        }
        if ((iStack_148 == first) && (uVar4 == 0)) {
          *(undefined1 *)((long)&i + (long)last_fnum * 2) = ranges._2_1_;
          *(undefined1 *)((long)&i + (long)last_fnum * 2 + 1) = ranges._3_1_;
        }
        else {
          iVar3 = XTextWidth16(*(undefined8 *)(buf._248_8_ + (long)iStack_148 * 8),&i,last_fnum);
          encodings._0_4_ = iVar3 + (int)encodings;
          last_fnum = 0;
          i._0_1_ = ranges._2_1_;
          i._1_1_ = ranges._3_1_;
          if (uVar4 != 0) {
            iVar3 = XTextWidth16(*(undefined8 *)(buf._248_8_ + (long)first * 8),&i,1);
            encodings._0_4_ = (int)encodings - iVar3;
          }
        }
        last_fnum = last_fnum + 1;
        _x = _x + (int)no_spc;
      }
      iVar5 = XTextWidth16(*(undefined8 *)(buf._248_8_ + (long)first * 8),&i,last_fnum);
      font_set_local._4_4_ = iVar5 + (int)encodings;
    }
    else {
      font_set_local._4_4_ = 0;
    }
  }
  return font_set_local._4_4_;
}

Assistant:

int
XUtf8TextWidth(XUtf8FontStruct 	*font_set,
	       const char 	*string,
	       int 		num_bytes) {

  int		x;
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;
  x = 0;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return x;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return x;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** measure the buffer **/
      x += XTextWidth16(fonts[fnum], buf, i);
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) {
      ucs = no_spc;
    }

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      x += XTextWidth16(fonts[last_fnum], buf, i);
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	/* go back to draw the non-spacing char over the previous char */
	x -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  x += XTextWidth16(fonts[last_fnum], buf, i);

  return x;
}